

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::appendInt(Builder *this,int64_t v,uint8_t base)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = intLength(v);
  if (bVar1 != 8) {
    v = v + (v >> 0x3f & 2L << (bVar1 * '\b' - 1 & 0x3f));
  }
  reserve(this,(ulong)(bVar1 + 1));
  appendByteUnchecked(this,base + bVar1);
  while (bVar2 = bVar1 != 0, bVar1 = bVar1 - 1, bVar2) {
    appendByteUnchecked(this,(uint8_t)v);
    v = (ulong)v >> 8;
  }
  return;
}

Assistant:

void appendInt(int64_t v, uint8_t base) {
    uint8_t vSize = intLength(v);
    uint64_t x;
    if (vSize == 8) {
      x = toUInt64(v);
    } else {
      int64_t shift = 1LL << (vSize * 8 - 1);  // will never overflow!
      x = v >= 0 ? static_cast<uint64_t>(v)
                 : static_cast<uint64_t>(v + shift) + shift;
    }
    reserve(1 + vSize);
    appendByteUnchecked(base + vSize);
    while (vSize-- > 0) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }